

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMultiCond.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionMultiCond::optimize_conditions
          (InstructionMultiCond *this,PtrPool<Hpipe::Instruction,_32> *inst_pool)

{
  bool bVar1;
  size_type sVar2;
  Cond *this_00;
  Transition *pTVar3;
  double *pdVar4;
  reference pRVar5;
  mapped_type_conflict *pmVar6;
  Node *node;
  Instruction *pIVar7;
  Vec<Hpipe::Transition> *pVVar8;
  reference pTVar9;
  double local_9c8;
  Transition *t_1;
  iterator __end1_3;
  iterator __begin1_3;
  Vec<Hpipe::Transition> *__range1_3;
  reference local_978;
  Transition *t;
  iterator __end1_2;
  iterator __begin1_2;
  Vec<Hpipe::Transition> *__range1_2;
  Vec<Hpipe::BranchSet::Range> local_938;
  undefined1 local_920 [8];
  BranchSet best_bs;
  Range *range_1;
  iterator __end1_1;
  iterator __begin1_1;
  Vec<Hpipe::BranchSet::Range> *__range1_1;
  Range *range;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::BranchSet::Range> *__range1;
  map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
  nb_ranges;
  Range local_870;
  uint local_850;
  uint local_84c;
  int i_2;
  int o;
  double cum_freq;
  Vec<Hpipe::BranchSet::Range> ranges;
  uint local_820;
  uint i_1;
  uint n;
  uint i;
  Instruction *inst [256];
  PtrPool<Hpipe::Instruction,_32> *inst_pool_local;
  InstructionMultiCond *this_local;
  
  if ((this->super_Instruction).op_id != Instruction::cur_op_id) {
    (this->super_Instruction).op_id = Instruction::cur_op_id;
    for (i_1 = 0; i_1 < 0x100; i_1 = i_1 + 1) {
      (&n + (ulong)i_1 * 2)[0] = 0;
      (&n + (ulong)i_1 * 2)[1] = 0;
    }
    inst[0xff] = (Instruction *)inst_pool;
    for (local_820 = 0;
        sVar2 = std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::size
                          (&(this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>),
        local_820 < sVar2; local_820 = local_820 + 1) {
      for (ranges.super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          ranges.super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0x100;
          ranges.super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ranges.
               super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        this_00 = Vec<Hpipe::Cond>::operator[](&this->conds,local_820);
        bVar1 = Cond::operator[](this_00,ranges.
                                         super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                                         .
                                         super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if (bVar1) {
          pTVar3 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,local_820);
          *(Instruction **)
           (&n + (ulong)ranges.
                        super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                        .
                        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 2) = pTVar3->inst
          ;
        }
      }
    }
    Vec<Hpipe::BranchSet::Range>::Vec((Vec<Hpipe::BranchSet::Range> *)&cum_freq);
    _i_2 = 0.0;
    local_84c = 0;
    while( true ) {
      bVar1 = false;
      if ((int)local_84c < 0x100) {
        bVar1 = *(long *)(&n + (long)(int)local_84c * 2) == 0;
      }
      local_850 = local_84c;
      if (!bVar1) break;
      local_84c = local_84c + 1;
    }
    while (local_850 = local_850 + 1, (int)local_850 < 0x100) {
      if ((*(long *)(&n + (long)(int)local_850 * 2) != 0) &&
         (*(long *)(&n + (long)(int)local_850 * 2) != *(long *)(&n + (long)(int)local_84c * 2))) {
        local_870.beg = local_84c;
        local_870.end = local_850;
        local_870.inst = *(Instruction **)(&n + (long)(int)local_84c * 2);
        local_870.name = (char *)0x0;
        local_870.freq = _i_2;
        std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
        emplace_back<Hpipe::BranchSet::Range>
                  ((vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> *)
                   &cum_freq,&local_870);
        _i_2 = 0.0;
        local_84c = local_850;
      }
      sVar2 = std::vector<double,_std::allocator<double>_>::size
                        (&(this->super_Instruction).freq.
                          super_vector<double,_std::allocator<double>_>);
      if (sVar2 == 0) {
        local_9c8 = 0.0;
      }
      else {
        pdVar4 = Vec<double>::operator[](&(this->super_Instruction).freq,local_850);
        local_9c8 = *pdVar4;
      }
      _i_2 = local_9c8 + _i_2;
    }
    if (local_84c != 0x100) {
      nb_ranges._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = local_84c;
      nb_ranges._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x100;
      std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
      emplace_back<Hpipe::BranchSet::Range>
                ((vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> *)
                 &cum_freq,(Range *)&nb_ranges._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::
    map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
    ::map((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
           *)&__range1);
    __end1 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::begin
                       ((vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> *
                        )&cum_freq);
    range = (Range *)std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                     ::end((vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            *)&cum_freq);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
                                       *)&range), bVar1) {
      pRVar5 = __gnu_cxx::
               __normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
               ::operator*(&__end1);
      pmVar6 = std::
               map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
               ::operator[]((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                             *)&__range1,&pRVar5->inst);
      *pmVar6 = *pmVar6 + 1.0;
      __gnu_cxx::
      __normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
      ::operator++(&__end1);
    }
    __end1_1 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::begin
                         ((vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                           *)&cum_freq);
    range_1 = (Range *)std::
                       vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
                       end((vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            *)&cum_freq);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
                               *)&range_1), bVar1) {
      best_bs.root._8_8_ =
           __gnu_cxx::
           __normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
           ::operator*(&__end1_1);
      pmVar6 = std::
               map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
               ::operator[]((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                             *)&__range1,&((reference)best_bs.root._8_8_)->inst);
      *(double *)(best_bs.root._8_8_ + 0x18) =
           0.001 / *pmVar6 + *(double *)(best_bs.root._8_8_ + 0x18);
      __gnu_cxx::
      __normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
      ::operator++(&__end1_1);
    }
    Vec<Hpipe::BranchSet::Range>::Vec(&local_938,(Vec<Hpipe::BranchSet::Range> *)&cum_freq);
    BranchSet::BranchSet((BranchSet *)local_920,&local_938);
    Vec<Hpipe::BranchSet::Range>::~Vec(&local_938);
    node = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr
                     ((AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete> *)local_920);
    pIVar7 = inst[0xff];
    Cond::Cond((Cond *)&__range1_2);
    pIVar7 = InstructionCond::make_cond
                       (node,(PtrPool<Hpipe::Instruction,_32> *)pIVar7,(Cond *)&__range1_2,
                        (bool)((this->super_Instruction).in_a_cycle & 1),
                        (this->super_Instruction).mark,this->off_data);
    Instruction::repl_in_preds(&this->super_Instruction,pIVar7);
    pVVar8 = &(this->super_Instruction).next;
    __end1_2 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                         (&pVVar8->
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    t = (Transition *)
        std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end
                  (&pVVar8->super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                               *)&t), bVar1) {
      local_978 = __gnu_cxx::
                  __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                  ::operator*(&__end1_2);
      __range1_3 = (Vec<Hpipe::Transition> *)this;
      Vec<Hpipe::Transition>::
      remove_first_checking<Hpipe::InstructionMultiCond::optimize_conditions(Hpipe::PtrPool<Hpipe::Instruction,32>&)::__0>
                (&local_978->inst->prev,(anon_class_8_1_8991fb9c *)&__range1_3);
      __gnu_cxx::
      __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
      ::operator++(&__end1_2);
    }
    pVVar8 = &(this->super_Instruction).next;
    __end1_3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                         (&pVVar8->
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    t_1 = (Transition *)
          std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end
                    (&pVVar8->super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                               *)&t_1), bVar1) {
      pTVar9 = __gnu_cxx::
               __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
               ::operator*(&__end1_3);
      (*pTVar9->inst->_vptr_Instruction[0xe])(pTVar9->inst,inst[0xff]);
      __gnu_cxx::
      __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
      ::operator++(&__end1_3);
    }
    BranchSet::~BranchSet((BranchSet *)local_920);
    std::
    map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
    ::~map((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
            *)&__range1);
    Vec<Hpipe::BranchSet::Range>::~Vec((Vec<Hpipe::BranchSet::Range> *)&cum_freq);
  }
  return;
}

Assistant:

void InstructionMultiCond::optimize_conditions( PtrPool<Instruction> &inst_pool ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    // char => instruction
    Instruction *inst[ 256 ];
    for( unsigned i = 0; i < 256; ++i )
        inst[ i ] = 0;
    for( unsigned n = 0; n < conds.size(); ++n )
        for( unsigned i = 0; i < 256; ++i )
            if ( conds[ n ][ i ] )
                inst[ i ] = next[ n ].inst;

    // input for BranchSet
    Vec<BranchSet::Range> ranges;
    double cum_freq = 0;
    int o = 0;
    while ( o < 256 and not inst[ o ] )
        ++o;
    for( int i = o + 1; i < 256; ++i ) {
        if ( inst[ i ] and inst[ i ] != inst[ o ] ) {
            ranges.emplace_back( BranchSet::Range{ o, i, inst[ o ], nullptr, cum_freq } );
            cum_freq = 0;
            o = i;
        }
        cum_freq += freq.size() ? freq[ i ] : 0;
    }
    if ( o != 256 )
        ranges.emplace_back( BranchSet::Range{ o, 256, inst[ o ], nullptr, cum_freq } );

    // to avoid freq 0
    std::map<Instruction *,double> nb_ranges;
    for( BranchSet::Range &range : ranges )
        ++nb_ranges[ range.inst ];
    for( BranchSet::Range &range : ranges )
        range.freq += 1e-3 / nb_ranges[ range.inst ];

    // if succession of cond seams to be a better solution, use them
    BranchSet best_bs( ranges );
    repl_in_preds( InstructionCond::make_cond( best_bs.root.ptr(), inst_pool, {}, in_a_cycle, mark, off_data ) );
    for( Transition &t : next )
        t.inst->prev.remove_first_checking( [&]( Transition &p ) { return p.inst == this; } );

    // following conditions
    for( Transition &t : next )
        t.inst->optimize_conditions( inst_pool );
}